

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O3

char * __thiscall
bloaty::CustomDataSource::_InternalParse(CustomDataSource *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  ArenaStringPtr *pAVar3;
  ArenaStringPtr *pAVar4;
  bool bVar5;
  Regex *msg;
  int iVar6;
  char *field_name;
  Rep *pRVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  byte *pbVar12;
  internal *this_00;
  string *psVar13;
  pair<const_char_*,_unsigned_int> pVar14;
  StringPiece str;
  byte *local_58;
  ArenaStringPtr *local_50;
  ArenaStringPtr *local_48;
  InternalMetadataWithArena *local_40;
  RepeatedPtrFieldBase *local_38;
  char *size;
  
  local_58 = (byte *)ptr;
  bVar5 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
  if (!bVar5) {
    local_38 = &(this->rewrite_).super_RepeatedPtrFieldBase;
    local_48 = &this->base_data_source_;
    local_50 = &this->name_;
    local_40 = &this->_internal_metadata_;
    do {
      bVar1 = *local_58;
      uVar10 = (ulong)bVar1;
      pbVar12 = local_58 + 1;
      if ((char)bVar1 < '\0') {
        uVar9 = ((uint)bVar1 + (uint)*pbVar12 * 0x80) - 0x80;
        uVar10 = (ulong)uVar9;
        if (-1 < (char)*pbVar12) {
          pbVar12 = local_58 + 2;
          goto LAB_001869c3;
        }
        pVar14 = google::protobuf::internal::ReadTagFallback((char *)local_58,uVar9);
        local_58 = (byte *)pVar14.first;
        if (local_58 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      else {
LAB_001869c3:
        pVar14._8_8_ = uVar10;
        pVar14.first = (char *)pbVar12;
        local_58 = pbVar12;
      }
      pAVar4 = local_48;
      pAVar3 = local_50;
      pbVar12 = (byte *)pVar14.first;
      uVar9 = pVar14.second;
      field_name = (char *)(pVar14._8_8_ >> 3 & 0x1fffffff);
      iVar6 = (int)field_name;
      cVar8 = (char)pVar14.second;
      if (iVar6 == 3) {
        if (cVar8 != '\x1a') goto LAB_00186b7a;
        local_58 = pbVar12 + -1;
        do {
          local_58 = local_58 + 1;
          pRVar7 = (this->rewrite_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar7 == (Rep *)0x0) {
            iVar6 = (this->rewrite_).super_RepeatedPtrFieldBase.total_size_;
LAB_00186afc:
            google::protobuf::internal::RepeatedPtrFieldBase::Reserve(local_38,iVar6 + 1);
            pRVar7 = (this->rewrite_).super_RepeatedPtrFieldBase.rep_;
            iVar6 = pRVar7->allocated_size;
LAB_00186b0e:
            pRVar7->allocated_size = iVar6 + 1;
            msg = google::protobuf::Arena::CreateMaybeMessage<bloaty::Regex>
                            ((this->rewrite_).super_RepeatedPtrFieldBase.arena_);
            pRVar7 = (this->rewrite_).super_RepeatedPtrFieldBase.rep_;
            iVar6 = (this->rewrite_).super_RepeatedPtrFieldBase.current_size_;
            (this->rewrite_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
            pRVar7->elements[iVar6] = msg;
          }
          else {
            iVar2 = (this->rewrite_).super_RepeatedPtrFieldBase.current_size_;
            iVar6 = pRVar7->allocated_size;
            if (iVar6 <= iVar2) {
              if (iVar6 == (this->rewrite_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00186afc;
              goto LAB_00186b0e;
            }
            (this->rewrite_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg = (Regex *)pRVar7->elements[iVar2];
          }
          local_58 = (byte *)google::protobuf::internal::ParseContext::ParseMessage<bloaty::Regex>
                                       (ctx,msg,(char *)local_58);
          if (local_58 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_58 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_58 == 0x1a));
      }
      else {
        if (iVar6 == 2) {
          if (cVar8 != '\x12') goto LAB_00186b7a;
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          psVar13 = (this->base_data_source_).ptr_;
          if (psVar13 ==
              (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
            google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                      (local_48,(string *)
                                &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
            psVar13 = pAVar4->ptr_;
            pbVar12 = local_58;
          }
          pbVar12 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                      (psVar13,(char *)pbVar12,ctx);
          this_00 = (internal *)(psVar13->_M_dataplus)._M_p;
          size = (char *)psVar13->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::StringPiece::LogFatalSizeTooBig
                      ((size_t)size,"size_t to int conversion");
          }
          pcVar11 = "bloaty.CustomDataSource.base_data_source";
LAB_00186ac5:
          str.length_ = (stringpiece_ssize_type)pcVar11;
          str.ptr_ = size;
          google::protobuf::internal::VerifyUTF8(this_00,str,field_name);
          local_58 = pbVar12;
        }
        else {
          if ((iVar6 == 1) && (cVar8 == '\n')) {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
            psVar13 = (this->name_).ptr_;
            if (psVar13 ==
                (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
              google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                        (local_50,(string *)
                                  &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
                        );
              psVar13 = pAVar3->ptr_;
              pbVar12 = local_58;
            }
            pbVar12 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                        (psVar13,(char *)pbVar12,ctx);
            this_00 = (internal *)(psVar13->_M_dataplus)._M_p;
            size = (char *)psVar13->_M_string_length;
            if ((long)size < 0) {
              google::protobuf::StringPiece::LogFatalSizeTooBig
                        ((size_t)size,"size_t to int conversion");
            }
            pcVar11 = "bloaty.CustomDataSource.name";
            goto LAB_00186ac5;
          }
LAB_00186b7a:
          if ((uVar9 == 0) || ((uVar9 & 7) == 4)) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar9 - 1;
            return (char *)local_58;
          }
          local_58 = (byte *)google::protobuf::internal::UnknownFieldParse
                                       (uVar9,local_40,(char *)pbVar12,ctx);
        }
        if (local_58 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar5 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
    } while (!bVar5);
  }
  return (char *)local_58;
}

Assistant:

const char* CustomDataSource::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "bloaty.CustomDataSource.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string base_data_source = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_base_data_source(), ptr, ctx, "bloaty.CustomDataSource.base_data_source");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .bloaty.Regex rewrite = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_rewrite(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}